

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

bool anon_unknown.dwarf_1c2de7::checkPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  float fVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  uint *puVar7;
  ulong uVar8;
  int y;
  long lVar9;
  int iVar10;
  long lVar11;
  float i;
  uif x;
  
  bVar2 = true;
  if (ly <= ry) {
    bVar2 = false;
    lVar11 = (long)ly;
    do {
      if (lx <= rx) {
        lVar4 = sampleCount->_sizeY;
        puVar7 = sampleCount->_data;
        lVar9 = (long)lx;
        do {
          if (puVar7[lVar4 * lVar11 + lVar9] != 0) {
            iVar10 = ((int)lVar11 * width + (int)lVar9) % 0x801;
            i = (float)iVar10;
            uVar8 = 0;
            do {
              fVar1 = half::_toFloat[ph->_data[ph->_sizeY * lVar11 + lVar9][uVar8]._h].f;
              uVar3 = (ushort)((uint)i >> 0x10);
              if (iVar10 != 0) {
                if (half::_eLut[(uint)i >> 0x17] == 0) {
                  uVar3 = half::convert((int)i);
                }
                else {
                  uVar3 = half::_eLut[(uint)i >> 0x17] +
                          (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0)
                                 >> 0xd);
                }
              }
              if ((fVar1 != half::_toFloat[uVar3].f) || (NAN(fVar1) || NAN(half::_toFloat[uVar3].f))
                 ) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample ",9);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
                poVar5 = operator<<(poVar5,(half)ph->_data[lVar11 * ph->_sizeY + lVar9][uVar8]._h);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
                plVar6 = (long *)std::ostream::operator<<(poVar5,iVar10);
                std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                std::ostream::put((char)plVar6);
                std::ostream::flush();
                std::ostream::flush();
                return bVar2;
              }
              uVar8 = uVar8 + 1;
              lVar4 = sampleCount->_sizeY;
              puVar7 = sampleCount->_data;
            } while (uVar8 < puVar7[lVar4 * lVar11 + lVar9]);
          }
          lVar9 = lVar9 + 1;
        } while (rx + 1 != (int)lVar9);
      }
      lVar4 = lVar11 + 1;
      bVar2 = ry <= lVar11;
      lVar11 = lVar4;
    } while (ry + 1 != (int)lVar4);
  }
  return bVar2;
}

Assistant:

bool checkPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph,
                  int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    return true;
}